

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_node_scalar_txt
          (REF_NODE ref_node,REF_INT ldim,REF_DBL *scalar,char *separator,REF_BOOL prepend_xyz,
          FILE *file)

{
  size_t __size;
  REF_MPI pRVar1;
  uint uVar2;
  uint uVar3;
  REF_STATUS RVar4;
  void *__ptr;
  void *__ptr_00;
  ulong uVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  REF_STATUS ref_private_macro_code_rxs;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  void *pvVar16;
  int iVar17;
  uint uVar18;
  double dVar19;
  uint local_c0;
  REF_INT local;
  REF_MPI local_b8;
  long local_b0;
  ulong local_a8;
  long local_a0;
  ulong local_98;
  FILE *local_90;
  long local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  void *local_60;
  void *local_58;
  REF_DBL *local_50;
  void *local_48;
  ulong local_40;
  char *local_38;
  
  local_b8 = ref_node->ref_mpi;
  uVar3 = (uint)(prepend_xyz != 0) * 3;
  lVar6 = ref_node->old_n_global;
  uVar14 = (int)(lVar6 / (long)local_b8->n) + 1;
  iVar17 = uVar3 + ldim;
  uVar2 = uVar14;
  if ((0 < local_b8->reduce_byte_limit) &&
     (uVar2 = local_b8->reduce_byte_limit / (iVar17 * 8 + 8), (int)uVar14 < (int)uVar2)) {
    uVar2 = uVar14;
  }
  uVar14 = iVar17 + 1;
  local_90 = (FILE *)file;
  local_50 = scalar;
  local_38 = separator;
  if ((int)(uVar2 * uVar14) < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x6d9,
           "ref_gather_node_scalar_txt","malloc local_xyzm of REF_DBL negative");
    RVar4 = 1;
  }
  else {
    local_68 = (ulong)(uVar2 * uVar14);
    __size = local_68 * 8;
    __ptr = malloc(__size);
    if (__ptr == (void *)0x0) {
      pcVar11 = "malloc local_xyzm of REF_DBL NULL";
      uVar7 = 0x6d9;
    }
    else {
      __ptr_00 = malloc(__size);
      if (__ptr_00 != (void *)0x0) {
        local_88 = (long)(int)uVar2;
        lVar13 = (long)iVar17;
        uVar18 = iVar17 - 1;
        uVar12 = 0;
        if (0 < ldim) {
          uVar12 = (ulong)(uint)ldim;
        }
        local_b0 = (long)(int)uVar14;
        uVar15 = 0;
        if (0 < (int)uVar18) {
          uVar15 = (ulong)uVar18;
        }
        local_a8 = (ulong)uVar3;
        local_58 = (void *)(lVar13 * 8 + (long)__ptr);
        local_48 = (void *)((long)__ptr_00 + lVar13 * 8);
        local_60 = (void *)((long)__ptr_00 + (long)(int)uVar18 * 8);
        local_a0 = local_b0 * 8;
        local_40 = (ulong)uVar14;
        lVar10 = 0;
        local_80 = (ulong)uVar2;
        do {
          uVar8 = lVar6 - lVar10;
          if (uVar8 == 0 || lVar6 < lVar10) {
            free(__ptr_00);
            free(__ptr);
            return 0;
          }
          if (local_88 < (long)uVar8) {
            uVar8 = local_80;
          }
          local_70 = uVar8 & 0xffffffff;
          for (uVar5 = 0; local_68 != uVar5; uVar5 = uVar5 + 1) {
            *(undefined8 *)((long)__ptr + uVar5 * 8) = 0;
          }
          local_78 = lVar10 + (int)uVar8;
          local_98 = local_70;
          if ((int)uVar8 < 1) {
            local_98 = 0;
          }
          pvVar16 = __ptr;
          uVar8 = local_a8;
          for (uVar5 = 0; pRVar1 = local_b8, uVar5 != local_98; uVar5 = uVar5 + 1) {
            uVar3 = ref_node_local(ref_node,lVar10 + uVar5,&local);
            if ((uVar3 != 0) && (uVar3 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x6e9,"ref_gather_node_scalar_txt",(ulong)uVar3,"node local failed");
              local_c0 = uVar3;
            }
            if (uVar3 == 5) {
LAB_0019abda:
              for (lVar6 = 0; lVar6 <= lVar13; lVar6 = lVar6 + 1) {
                *(undefined8 *)((long)pvVar16 + lVar6 * 8) = 0;
              }
            }
            else {
              if (uVar3 != 0) {
                return local_c0;
              }
              if (local_b8->id != ref_node->part[local]) goto LAB_0019abda;
              for (uVar9 = 0; local_a8 != uVar9; uVar9 = uVar9 + 1) {
                *(REF_DBL *)((long)pvVar16 + uVar9 * 8) =
                     ref_node->real[(long)(local * 0xf) + uVar9];
              }
              for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
                *(REF_DBL *)((long)__ptr + (long)((int)uVar8 + (int)uVar9) * 8) =
                     local_50[(long)(local * ldim) + uVar9];
              }
              *(undefined8 *)((long)local_58 + uVar5 * local_b0 * 8) = 0x3ff0000000000000;
            }
            pvVar16 = (void *)((long)pvVar16 + local_a0);
            uVar8 = uVar8 + local_40;
          }
          uVar3 = ref_mpi_sum(local_b8,__ptr,__ptr_00,(int)local_70 * uVar14,3);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x6fb,"ref_gather_node_scalar_txt",(ulong)uVar3,"sum");
            return uVar3;
          }
          if (pRVar1->id == 0) {
            pvVar16 = __ptr_00;
            for (uVar8 = 0; uVar8 != local_98; uVar8 = uVar8 + 1) {
              lVar6 = uVar8 * local_b0;
              dVar19 = *(double *)((long)local_48 + lVar6 * 8) + -1.0;
              if (dVar19 <= -dVar19) {
                dVar19 = -dVar19;
              }
              if (0.1 < dVar19) {
                printf("error gather node %ld %f\n",lVar10 + uVar8);
              }
              for (uVar5 = 0; uVar15 != uVar5; uVar5 = uVar5 + 1) {
                fprintf(local_90,"%.15e%s",*(undefined8 *)((long)pvVar16 + uVar5 * 8),local_38);
              }
              if (0 < ldim) {
                fprintf(local_90,"%.15e\n",*(undefined8 *)((long)local_60 + lVar6 * 8));
              }
              pvVar16 = (void *)((long)pvVar16 + local_a0);
            }
          }
          lVar6 = ref_node->old_n_global;
          lVar10 = local_78;
        } while( true );
      }
      pcVar11 = "malloc xyzm of REF_DBL NULL";
      uVar7 = 0x6da;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar7,
           "ref_gather_node_scalar_txt",pcVar11);
    RVar4 = 2;
  }
  return RVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_scalar_txt(
    REF_NODE ref_node, REF_INT ldim, REF_DBL *scalar, const char *separator,
    REF_BOOL prepend_xyz, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im, nxyz;
  REF_STATUS status;

  nxyz = 0;
  if (prepend_xyz) nxyz = 3;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk =
      MIN(chunk, ref_mpi_reduce_chunk_limit(
                     ref_mpi, (nxyz + ldim + 1) * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, (nxyz + ldim + 1) * chunk, REF_DBL);
  ref_malloc(xyzm, (nxyz + ldim + 1) * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < (nxyz + ldim + 1) * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        for (im = 0; im < nxyz; im++)
          local_xyzm[im + (nxyz + ldim + 1) * i] =
              ref_node_xyz(ref_node, im, local);
        for (im = 0; im < ldim; im++)
          local_xyzm[nxyz + im + (nxyz + ldim + 1) * i] =
              scalar[im + ldim * local];
        local_xyzm[nxyz + ldim + (nxyz + ldim + 1) * i] = 1.0;
      } else {
        for (im = 0; im < (nxyz + ldim + 1); im++)
          local_xyzm[im + (nxyz + ldim + 1) * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, (nxyz + ldim + 1) * n,
                    REF_DBL_TYPE),
        "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[nxyz + ldim + (nxyz + ldim + 1) * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[nxyz + ldim + (nxyz + ldim + 1) * i]);
        }
        for (im = 0; im < nxyz + ldim - 1; im++) {
          fprintf(file, "%.15e%s", xyzm[im + (nxyz + ldim + 1) * i], separator);
        }
        if (ldim > 0)
          fprintf(file, "%.15e\n",
                  xyzm[(nxyz + ldim - 1) + (nxyz + ldim + 1) * i]);
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  return REF_SUCCESS;
}